

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O2

int __thiscall FStateLabelStorage::AddPointer(FStateLabelStorage *this,FState *ptr)

{
  uchar *puVar1;
  uint uVar2;
  
  if (ptr != (FState *)0x0) {
    uVar2 = TArray<unsigned_char,_unsigned_char>::Reserve(&this->Storage,0xc);
    puVar1 = (this->Storage).Array + (int)uVar2;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(FState **)((this->Storage).Array + (long)(int)uVar2 + 4) = ptr;
    return (int)uVar2 / 4 + 1;
  }
  return 0;
}

Assistant:

int AddPointer(FState *ptr)
	{
		if (ptr != nullptr)
		{
			int pos = Storage.Reserve(sizeof(ptr) + sizeof(int));
			memset(&Storage[pos], 0, sizeof(int));
			memcpy(&Storage[pos + sizeof(int)], &ptr, sizeof(ptr));
			return pos / 4 + 1;
		}
		else return 0;
	}